

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O2

unsigned_long __thiscall
fakeit::ActionSequence<unsigned_long>::handleMethodInvocation
          (ActionSequence<unsigned_long> *this,ArgumentsTuple<> *args)

{
  long *plVar1;
  unsigned_long uVar2;
  shared_ptr<fakeit::Destructible> destructablePtr;
  Finally onExit;
  __shared_ptr<fakeit::Destructible,_(__gnu_cxx::_Lock_policy)2> local_88;
  function<void_()> local_78;
  function<void_()> local_58;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  std::__shared_ptr<fakeit::Destructible,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,
             &((this->_recordedActions).
               super__Vector_base<std::shared_ptr<fakeit::Destructible>,_std::allocator<std::shared_ptr<fakeit::Destructible>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<fakeit::Destructible,_(__gnu_cxx::_Lock_policy)2>);
  plVar1 = (long *)__dynamic_cast(local_88._M_ptr,&Destructible::typeinfo,
                                  &Action<unsigned_long>::typeinfo,0);
  if (plVar1 != (long *)0x0) {
    local_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/externalInclude/FakeIt/single_header/boost/fakeit.hpp:7277:51)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/externalInclude/FakeIt/single_header/boost/fakeit.hpp:7277:51)>
               ::_M_manager;
    local_38._M_unused._M_object = plVar1;
    local_38._8_8_ = this;
    std::function<void_()>::function(&local_78,(function<void_()> *)&local_38);
    std::function<void_()>::function(&local_58,&local_78);
    std::_Function_base::~_Function_base(&local_78.super__Function_base);
    uVar2 = (**(code **)(*plVar1 + 0x10))(plVar1,args);
    Finally::~Finally((Finally *)&local_58);
    std::_Function_base::~_Function_base((_Function_base *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    return uVar2;
  }
  __cxa_bad_cast();
}

Assistant:

virtual R handleMethodInvocation(ArgumentsTuple<arglist...> & args) override
        {
            std::shared_ptr<Destructible> destructablePtr = _recordedActions.front();
            Destructible &destructable = *destructablePtr;
            Action<R, arglist...> &action = dynamic_cast<Action<R, arglist...> &>(destructable);
            std::function<void()> finallyClause = [&]() -> void {
                if (action.isDone())
                    _recordedActions.erase(_recordedActions.begin());
            };
            Finally onExit(finallyClause);
            return action.invoke(args);
        }